

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O0

void golf_gi_start_lightmap(golf_gi_t *gi,golf_lightmap_image_t *lightmap_image)

{
  undefined1 local_d0 [8];
  golf_gi_entity_t entity;
  golf_lightmap_image_t *lightmap_image_local;
  golf_gi_t *gi_local;
  
  if ((gi->has_cur_entity & 1U) == 0) {
    entity.gi_lightmap_sections.alloc_category = &lightmap_image->active;
    memset(local_d0,0,0x18);
    entity.positions._8_8_ = (long)"glGetStringi" + 10;
    memset(&entity.positions.alloc_category,0,0x18);
    entity.normals._8_8_ = (long)"glGetStringi" + 10;
    memset(&entity.normals.alloc_category,0,0x18);
    entity.lightmap_uvs._8_8_ = (long)"glGetStringi" + 10;
    memset(&entity.lightmap_uvs.alloc_category,0,0x18);
    entity.ignore._8_8_ = (long)"glGetStringi" + 10;
    memset(&entity.lightmap_image,0,0x18);
    entity.gi_lightmap_sections._8_8_ = (long)"glGetStringi" + 10;
    entity.image_width = *(int *)(entity.gi_lightmap_sections.alloc_category + 0x50);
    entity.image_height._0_1_ = entity.gi_lightmap_sections.alloc_category[0x54] & 1;
    entity.time_length = *(float *)(entity.gi_lightmap_sections.alloc_category + 0x58);
    entity.ignore.alloc_category._0_4_ =
         *(undefined4 *)(entity.gi_lightmap_sections.alloc_category + 0x44);
    entity.ignore.alloc_category._4_4_ =
         *(undefined4 *)(entity.gi_lightmap_sections.alloc_category + 0x48);
    entity.resolution = *(int *)(entity.gi_lightmap_sections.alloc_category + 0x4c);
    entity._144_8_ = entity.gi_lightmap_sections.alloc_category;
    gi->has_cur_entity = true;
    memcpy(&gi->cur_entity,local_d0,0xb8);
  }
  return;
}

Assistant:

void golf_gi_start_lightmap(golf_gi_t *gi, golf_lightmap_image_t *lightmap_image) {
    if (gi->has_cur_entity) {
        return;
    }

    golf_gi_entity_t entity;
    vec_init(&entity.positions, "gi");
    vec_init(&entity.normals, "gi");
    vec_init(&entity.lightmap_uvs, "gi");
    vec_init(&entity.ignore, "gi");
    vec_init(&entity.gi_lightmap_sections, "gi");

    entity.time_length = lightmap_image->time_length;
    entity.repeats = lightmap_image->repeats;
    entity.num_samples = lightmap_image->num_samples;
    entity.resolution = lightmap_image->resolution;
    entity.image_width = lightmap_image->width;
    entity.image_height = lightmap_image->height;
    entity.lightmap_image = lightmap_image;

    gi->has_cur_entity = true;
    gi->cur_entity = entity;
}